

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O2

uint32_t * FastPForLib::__fastpackwithoutmask7_16(uint32_t *in,uint32_t *out)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  vpmovsxbd_avx(ZEXT416(0x3c342410));
  auVar5 = vpinsrd_avx(ZEXT416(in[2]),in[7],1);
  auVar5 = vpsllvd_avx2(auVar5,_DAT_001a3ae0);
  auVar4 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)in[10]));
  uVar3 = in[10] << 6;
  auVar1 = vpshufd_avx(auVar4,0xaa);
  auVar5 = vpinsrd_avx(auVar5,in[0xb] << 0xd,2);
  auVar2 = vpsllvd_avx2(auVar4,_DAT_001a3b20);
  auVar6 = vpinsrd_avx(ZEXT416(in[1] << 7 | *in),auVar4._0_4_ >> 4 | in[6] << 10 | in[5] << 3,1);
  auVar6 = vpinsrd_avx(auVar6,auVar4._4_4_ >> 1 | uVar3,2);
  auVar5 = vpor_avx(auVar5,auVar6);
  auVar6 = vpsrld_avx(auVar1,5);
  auVar5 = vpblendd_avx2(auVar5,auVar6,8);
  vpmovsxbd_avx(ZEXT416(0x3830200c));
  auVar6 = vpgatherdd_avx512vl(*(undefined4 *)((long)in + (ulong)uVar3));
  auVar6 = vpsllvd_avx2(auVar6,_DAT_001a3b10);
  auVar5 = vpternlogd_avx512vl(auVar2,auVar6,auVar5,0xfe);
  *(undefined1 (*) [16])out = auVar5;
  return out + 4;
}

Assistant:

uint32_t *__fastpackwithoutmask7_16(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 7;
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 21;
  ++in;
  *out |= ((*in)) << 28;
  ++out;
  *out = ((*in)) >> (7 - 3);
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 17;
  ++in;
  *out |= ((*in)) << 24;
  ++in;
  *out |= ((*in)) << 31;
  ++out;
  *out = ((*in)) >> (7 - 6);
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 27;
  ++out;
  *out = ((*in)) >> (7 - 2);
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 9;
  ++in;

  return out + 1;
}